

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void bigval_final_reduce(bigval *n)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  BignumDblInt ADC_temp_5;
  BignumDblInt ADC_temp_4;
  BignumDblInt ADC_temp_3;
  BignumDblInt ADC_temp_2;
  BignumDblInt ADC_temp_1;
  BignumDblInt ADC_temp;
  BignumCarry carry;
  BignumInt v19;
  BignumInt v18;
  BignumInt v17;
  BignumInt v16;
  BignumInt v14;
  BignumInt v13;
  BignumInt v12;
  BignumInt v11;
  BignumInt v10;
  BignumInt v9;
  BignumInt v8;
  BignumInt v7;
  BignumInt v5;
  BignumInt v4;
  BignumInt v3;
  BignumInt v2;
  BignumInt v1;
  BignumInt v0;
  bigval *n_local;
  
  uVar1 = (n->w[2] >> 2) * 5;
  uVar4 = n->w[0] + uVar1;
  uVar1 = (ulong)CARRY8(n->w[0],uVar1);
  uVar5 = n->w[1] + uVar1;
  lVar2 = (n->w[2] & 3) + (ulong)CARRY8(n->w[1],uVar1);
  uVar3 = (lVar2 + (ulong)CARRY8(uVar5,(ulong)(0xfffffffffffffffa < uVar4)) >> 2) * 5;
  uVar1 = (ulong)CARRY8(uVar4,uVar3);
  n->w[0] = uVar4 + uVar3;
  n->w[1] = uVar5 + uVar1;
  n->w[2] = lVar2 + (ulong)CARRY8(uVar5,uVar1) & 3;
  return;
}

Assistant:

static void bigval_final_reduce(bigval *n)
{
    BignumInt v0, v1, v2, v3, v4, v5, v7, v8, v9, v10, v11, v12, v13, v14;
    BignumInt v16, v17, v18, v19;
    BignumCarry carry;

    v0 = n->w[0];
    v1 = n->w[1];
    v2 = n->w[2];
    v3 = (v2) >> 2;
    v4 = (v2) & ((((BignumInt)1) << 2)-1);
    v5 = 5 * v3;
    BignumADC(v7, carry, v0, v5, 0);
    BignumADC(v8, carry, v1, 0, carry);
    v9 = v4 + 0 + carry;
    BignumADC(v10, carry, v7, 5, 0);
    (void)v10;
    BignumADC(v11, carry, v8, 0, carry);
    (void)v11;
    v12 = v9 + 0 + carry;
    v13 = (v12) >> 2;
    v14 = 5 * v13;
    BignumADC(v16, carry, v7, v14, 0);
    BignumADC(v17, carry, v8, 0, carry);
    v18 = v9 + 0 + carry;
    v19 = (v18) & ((((BignumInt)1) << 2)-1);
    n->w[0] = v16;
    n->w[1] = v17;
    n->w[2] = v19;
}